

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O0

void __thiscall t_netstd_generator::generate_enum(t_netstd_generator *this,t_enum *tenum)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  int __oflag;
  ostream *out;
  allocator local_251;
  string local_250 [32];
  undefined1 local_230 [8];
  ofstream_with_content_based_conditional_update f_enum;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string f_enum_name;
  int ic;
  t_enum *tenum_local;
  t_netstd_generator *this_local;
  
  f_enum_name.field_2._12_4_ = t_generator::indent_count((t_generator *)this);
  std::operator+(&local_80,&this->namespace_dir_,"/");
  iVar1 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])();
  std::operator+(&local_60,&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(extraout_var,iVar1));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 &local_60,".cs");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,pcVar2,&local_251);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230,(char *)local_250,__oflag);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  out = (ostream *)local_230;
  generate_enum(this,out,tenum);
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230,(int)out);
  t_generator::indent_validate((t_generator *)this,f_enum_name.field_2._12_4_,"generate_enum");
  template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::
  ~template_ofstream_with_content_based_conditional_update
            ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
              *)local_230);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void t_netstd_generator::generate_enum(t_enum* tenum)
{
    int ic = indent_count();
    string f_enum_name = namespace_dir_ + "/" + tenum->get_name() + ".cs";

    ofstream_with_content_based_conditional_update f_enum;
    f_enum.open(f_enum_name.c_str());

    generate_enum(f_enum, tenum);

    f_enum.close();
    indent_validate(ic, "generate_enum");
}